

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::EGLThread::~EGLThread(EGLThread *this)

{
  (this->super_Thread).super_Thread._vptr_Thread = (_func_int **)&PTR__EGLThread_01e08188;
  deinit(this);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&this->runtimeContext);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&this->surface);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&this->context);
  tcu::ThreadUtil::Thread::~Thread(&this->super_Thread);
  return;
}

Assistant:

EGLThread::~EGLThread (void)
{
	EGLThread::deinit();
}